

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOpaqueAttribute.cpp
# Opt level: O3

void __thiscall
Imf_3_4::OpaqueAttribute::readValueFrom(OpaqueAttribute *this,IStream *is,int size,int version)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  
  uVar3 = (ulong)size;
  pcVar2 = (char *)operator_new__(uVar3);
  pcVar1 = (this->_data)._data;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (this->_data)._size = uVar3;
  (this->_data)._data = pcVar2;
  this->_dataSize = uVar3;
  (*is->_vptr_IStream[3])(is,pcVar2,(ulong)(uint)size);
  return;
}

Assistant:

void
OpaqueAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    _data.resizeErase (size);
    _dataSize = size;
    Xdr::read<StreamIO> (is, _data, size);
}